

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O3

void __thiscall
google::protobuf::UninterpretedOption::set_identifier_value(UninterpretedOption *this,string *value)

{
  string *psVar1;
  
  *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 2;
  psVar1 = this->identifier_value_;
  if (psVar1 == (string *)internal::kEmptyString_abi_cxx11_) {
    psVar1 = (string *)operator_new(0x20);
    (psVar1->_M_dataplus)._M_p = (pointer)&psVar1->field_2;
    psVar1->_M_string_length = 0;
    (psVar1->field_2)._M_local_buf[0] = '\0';
    this->identifier_value_ = psVar1;
  }
  std::__cxx11::string::_M_assign((string *)psVar1);
  return;
}

Assistant:

inline void UninterpretedOption::set_identifier_value(const ::std::string& value) {
  set_has_identifier_value();
  if (identifier_value_ == &::google::protobuf::internal::kEmptyString) {
    identifier_value_ = new ::std::string;
  }
  identifier_value_->assign(value);
}